

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int parse_entry(char *buff,entry *entry_i)

{
  ucs4_t *puVar1;
  ucs4_t *puVar2;
  ucs4_t **ppuVar3;
  bool bVar4;
  size_t local_50;
  ssize_t i;
  size_t value_count;
  size_t value_i;
  ucs4_t *ucs4_buff;
  char *pbuff;
  size_t length;
  entry *entry_i_local;
  char *buff_local;
  
  ucs4_buff = (ucs4_t *)buff;
  while( true ) {
    bVar4 = false;
    if ((char)*ucs4_buff != '\t') {
      bVar4 = (char)*ucs4_buff != '\0';
    }
    if (!bVar4) break;
    ucs4_buff = (ucs4_t *)((long)ucs4_buff + 1);
  }
  if ((char)*ucs4_buff != '\0') {
    puVar1 = utf8_to_ucs4(buff,(long)ucs4_buff - (long)buff);
    if (puVar1 != (ucs4_t *)0xffffffffffffffff) {
      puVar2 = (ucs4_t *)malloc((((long)ucs4_buff - (long)buff) + 1U) * 4);
      entry_i->key = puVar2;
      ucs4cpy(entry_i->key,puVar1);
      free(puVar1);
      i = 0x400;
      ppuVar3 = (ucs4_t **)malloc(0x2000);
      entry_i->value = ppuVar3;
      value_count = 0;
      while( true ) {
        bVar4 = false;
        if ((char)*ucs4_buff != '\0') {
          bVar4 = (char)*ucs4_buff != '\n';
        }
        if (!bVar4) {
          ppuVar3 = (ucs4_t **)realloc(entry_i->value,i << 3);
          entry_i->value = ppuVar3;
          entry_i->value[value_count] = (ucs4_t *)0x0;
          return 0;
        }
        if ((ulong)i <= value_count) {
          ppuVar3 = (ucs4_t **)realloc(entry_i->value,i << 4);
          entry_i->value = ppuVar3;
          i = i * 2;
        }
        puVar1 = (ucs4_t *)((long)ucs4_buff + 1);
        ucs4_buff = puVar1;
        while( true ) {
          bVar4 = false;
          if (((char)*ucs4_buff != ' ') && (bVar4 = false, (char)*ucs4_buff != '\0')) {
            bVar4 = (char)*ucs4_buff != '\n';
          }
          if (!bVar4) break;
          ucs4_buff = (ucs4_t *)((long)ucs4_buff + 1);
        }
        puVar2 = utf8_to_ucs4((char *)puVar1,(long)ucs4_buff - (long)puVar1);
        local_50 = value_count;
        if (puVar2 == (ucs4_t *)0xffffffffffffffff) break;
        puVar1 = (ucs4_t *)malloc((((long)ucs4_buff - (long)puVar1) + 1U) * 4);
        entry_i->value[value_count] = puVar1;
        ucs4cpy(entry_i->value[value_count],puVar2);
        free(puVar2);
        value_count = value_count + 1;
      }
      while (local_50 = local_50 - 1, -1 < (long)local_50) {
        free(entry_i->value[local_50]);
      }
      free(entry_i->value);
      free(entry_i->key);
    }
  }
  return -1;
}

Assistant:

int parse_entry(const char * buff, entry * entry_i)
{
	size_t length;
	const char * pbuff;

	/* 解析鍵 */
	for (pbuff = buff; *pbuff != '\t' && *pbuff != '\0'; ++ pbuff)
		;
	if (*pbuff == '\0')
		return -1;
	length = pbuff - buff;

	ucs4_t * ucs4_buff;
	ucs4_buff = utf8_to_ucs4(buff, length);
	if (ucs4_buff == (ucs4_t *) -1)
		return -1;
	entry_i->key = (ucs4_t *) malloc((length + 1) * sizeof(ucs4_t));
	ucs4cpy(entry_i->key, ucs4_buff);
	free(ucs4_buff);

	/* 解析值 */
	size_t value_i, value_count = INITIAL_DICTIONARY_SIZE;
	entry_i->value = (ucs4_t **) malloc(value_count * sizeof (ucs4_t *));

	for (value_i = 0; *pbuff != '\0' && *pbuff != '\n'; ++ value_i)
	{
		if (value_i >= value_count)
		{
			value_count += value_count;
			entry_i->value = (ucs4_t **) realloc(
					entry_i->value,
					value_count * sizeof (ucs4_t *)
			);
		}

		for (buff = ++ pbuff; *pbuff != ' ' && *pbuff != '\0' && *pbuff != '\n'; ++ pbuff)
			;
		length = pbuff - buff;
		ucs4_buff = utf8_to_ucs4(buff, length);
		if (ucs4_buff == (ucs4_t *) -1)
		{
			/* 發生錯誤 回退內存申請 */
			ssize_t i;
			for (i = value_i - 1; i >= 0; -- i)
				free(entry_i->value[i]);
			free(entry_i->value);
			free(entry_i->key);
			return -1;
		}

		entry_i->value[value_i] = (ucs4_t *) malloc((length + 1) * sizeof(ucs4_t));
		ucs4cpy(entry_i->value[value_i], ucs4_buff);
		free(ucs4_buff);
	}

	entry_i->value = (ucs4_t **) realloc(
			entry_i->value,
			value_count * sizeof (ucs4_t *)
	);
	entry_i->value[value_i] = NULL;

	return 0;
}